

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O2

void ParsePciEBifurcationBlock(PciEBifurcationBlock_t *dblock)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  PciELane_t *pPVar8;
  
  pPVar8 = dblock->LaneDescriptors;
  puts("   COM-HPC PCI-E Bifurcation block:");
  for (uVar3 = 0; uVar3 < dblock->NrOfLaneDescriptors; uVar3 = uVar3 + 1) {
    bVar1 = pPVar8->NrOfConfigurations;
    bVar2 = pPVar8->LaneCapabilities;
    pcVar4 = "; NVME";
    if ((bVar2 & 0x20) == 0) {
      pcVar4 = "";
    }
    pcVar6 = "; PEG";
    if ((bVar2 & 0x40) == 0) {
      pcVar6 = "";
    }
    pcVar7 = "; Target";
    if (-1 < (char)bVar2) {
      pcVar7 = "";
    }
    printf("      Lane %d: Gen%d%s%s%s\n",(ulong)pPVar8->LaneNumber,(ulong)(bVar2 & 0xf),pcVar4,
           pcVar6,pcVar7);
    printf("         Configurations: ");
    for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
      pcVar4 = "(R)";
      if (-1 < (char)pPVar8->Configurations[uVar5]) {
        pcVar4 = "";
      }
      printf("%d%s ",(ulong)(pPVar8->Configurations[uVar5] & 0x3f),pcVar4);
    }
    putchar(10);
    pPVar8 = (PciELane_t *)(pPVar8->Configurations + bVar1);
  }
  return;
}

Assistant:

void ParsePciEBifurcationBlock(PciEBifurcationBlock_t *dblock)
{
    int idx1, idx2;
    PciELane_t *laneDescr = dblock->LaneDescriptors;
	printf("   COM-HPC PCI-E Bifurcation block:\n");
    for(idx1 = 0; idx1 < dblock->NrOfLaneDescriptors; idx1++) {
        int count2 = laneDescr->NrOfConfigurations;
        printf("      Lane %d: Gen%d%s%s%s\n", 
            laneDescr->LaneNumber, 
            laneDescr->LaneCapabilities & 0xF,
            laneDescr->LaneCapabilities & 0x20 ? "; NVME" : "",
            laneDescr->LaneCapabilities & 0x40 ? "; PEG" : "",
            laneDescr->LaneCapabilities & 0x80 ? "; Target" : "");
        printf("         Configurations: ");
        for(idx2 = 0; idx2 < count2; idx2++) {
            printf("%d%s ", 
                laneDescr->Configurations[idx2] & 0x3F,
                laneDescr->Configurations[idx2] & 0x80 ? "(R)" : ""); 
        }
        printf("\n");
        laneDescr = (PciELane_t *)((const char *)laneDescr + FIELD_OFFSET(PciELane_t, Configurations) + count2);
    }
}